

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcBooleanClippingResult::~IfcBooleanClippingResult
          (IfcBooleanClippingResult *this,void **vtt)

{
  void **vtt_local;
  IfcBooleanClippingResult *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBooleanClippingResult,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBooleanClippingResult,_0UL> *)
             &(this->super_IfcBooleanResult).field_0x70,vtt + 0x10);
  IfcBooleanResult::~IfcBooleanResult(&this->super_IfcBooleanResult,vtt + 1);
  return;
}

Assistant:

IfcBooleanClippingResult() : Object("IfcBooleanClippingResult") {}